

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlElementSize(uint64 type,uint8 *value,uint64 size)

{
  int32 iVar1;
  int32 iVar2;
  uint64 in_RDX;
  long in_RSI;
  uint64 in_RDI;
  uint64 ebml_size;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else {
    iVar1 = GetUIntSize(in_RDI);
    iVar2 = GetCodedUIntSize(in_RDX);
    local_8 = (long)iVar2 + in_RDX + (long)iVar1;
  }
  return local_8;
}

Assistant:

uint64 EbmlElementSize(uint64 type, const uint8* value, uint64 size) {
  if (!value)
    return 0;

  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += size;

  // Size of Datasize
  ebml_size += GetCodedUIntSize(size);

  return ebml_size;
}